

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O0

void __thiscall FMapInfoParser::ParseOpenBrace(FMapInfoParser *this)

{
  bool bVar1;
  int iVar2;
  FMapInfoParser *this_local;
  
  if (this->format_type != 1) {
    if (this->format_type == 2) {
      FScanner::MustGetStringName(&this->sc,"{");
      FScanner::SetCMode(&this->sc,true);
    }
    else {
      bVar1 = FScanner::CheckString(&this->sc,"{");
      iVar2 = 1;
      if (bVar1) {
        iVar2 = 2;
      }
      this->format_type = iVar2;
      if (this->format_type == 2) {
        FScanner::SetCMode(&this->sc,true);
      }
    }
  }
  return;
}

Assistant:

void FMapInfoParser::ParseOpenBrace()
{
	switch(format_type)
	{
	default:
		format_type = sc.CheckString("{") ? FMT_New : FMT_Old;
		if (format_type == FMT_New) 
			sc.SetCMode(true);
		break;

	case FMT_Old:
		break;

	case FMT_New:
		sc.MustGetStringName("{");
		sc.SetCMode(true);
		break;
	}
}